

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultMinimize::minimize(DefaultMinimize *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  bool bVar1;
  uint32 uVar2;
  Literal LVar3;
  SharedContext *this_00;
  char *pcVar4;
  Solver *in_RSI;
  long in_RDI;
  UndoInfo u;
  uint32 i;
  Literal x;
  uint32 stop;
  Solver *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  long lVar5;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffc8;
  uint __c;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar7;
  
  uVar2 = Solver::reasonData(in_stack_ffffffffffffffa8,
                             (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  this_00 = Solver::sharedContext(in_RSI);
  LVar3 = SharedContext::stepLiteral(this_00);
  bVar1 = Solver::ccMinimize((Solver *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                             ,LVar3,(CCMinRecursive *)
                                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
    uVar7 = *(uint *)(in_RDI + 0x10);
    pcVar4 = (char *)(ulong)uVar7;
    bVar1 = Solver::ccMinimize((Solver *)CONCAT44(uVar7,in_stack_ffffffffffffffc8),LVar3,
                               (CCMinRecursive *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (bVar1) {
      __c = 0;
      while( true ) {
        if (__c == uVar2) {
          return true;
        }
        uVar6 = *(undefined4 *)(*(long *)(in_RDI + 0x28) + (ulong)__c * 4);
        lVar5 = *(long *)(in_RDI + 8);
        pcVar4 = UndoInfo::index((UndoInfo *)&stack0xffffffffffffffc4,pcVar4,__c);
        LVar3.rep_ = *(uint32 *)(lVar5 + 0x68 + ((ulong)pcVar4 & 0xffffffff) * 8);
        pcVar4 = (char *)(ulong)LVar3.rep_;
        bVar1 = Solver::ccMinimize((Solver *)CONCAT44(uVar7,__c),LVar3,
                                   (CCMinRecursive *)CONCAT44(uVar6,LVar3.rep_));
        if (!bVar1) break;
        __c = __c + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool DefaultMinimize::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	assert(s.isTrue(tag_));
	uint32 stop = s.reasonData(p);
	Literal   x = s.sharedContext()->stepLiteral();
	assert(stop <= undoTop_);
	if (!s.ccMinimize(x, rec) || !s.ccMinimize(tag_, rec)) { return false; }
	for (uint32 i = 0; i != stop; ++i) {
		UndoInfo u = undo_[i];
		x = shared_->lits[u.index()].first;
		if (!s.ccMinimize(x, rec)) {
			return false;
		}
	}
	return true;
}